

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ModelDescription::MergeFrom(ModelDescription *this,ModelDescription *from)

{
  void *pvVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *other;
  Metadata *this_00;
  Metadata *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/Model.pb.cc"
               ,0x97c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase,&(from->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase,&(from->output_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->traininginput_).super_RepeatedPtrFieldBase,
             &(from->traininginput_).super_RepeatedPtrFieldBase);
  psVar2 = (from->predictedfeaturename_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->predictedfeaturename_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->predictedfeaturename_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  psVar2 = (from->predictedprobabilitiesname_).ptr_;
  if ((psVar2->_M_string_length != 0) &&
     (psVar3 = (this->predictedprobabilitiesname_).ptr_, psVar3 != psVar2)) {
    if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this->predictedprobabilitiesname_,psVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  from_00 = from->metadata_;
  if (from_00 != (Metadata *)0x0 && from != (ModelDescription *)&_ModelDescription_default_instance_
     ) {
    this_00 = this->metadata_;
    if (this_00 == (Metadata *)0x0) {
      this_00 = (Metadata *)operator_new(0x58);
      Metadata::Metadata(this_00);
      this->metadata_ = this_00;
      from_00 = from->metadata_;
    }
    if (from_00 == (Metadata *)0x0) {
      from_00 = (Metadata *)&_Metadata_default_instance_;
    }
    Metadata::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void ModelDescription::MergeFrom(const ModelDescription& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ModelDescription)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  output_.MergeFrom(from.output_);
  traininginput_.MergeFrom(from.traininginput_);
  if (from.predictedfeaturename().size() > 0) {

    predictedfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedfeaturename_);
  }
  if (from.predictedprobabilitiesname().size() > 0) {

    predictedprobabilitiesname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedprobabilitiesname_);
  }
  if (from.has_metadata()) {
    mutable_metadata()->::CoreML::Specification::Metadata::MergeFrom(from.metadata());
  }
}